

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

void __thiscall Graph<Node>::connectedComponents(Graph<Node> *this)

{
  vector<int> *pvVar1;
  int *piVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  bool *__s;
  size_t extraout_RDX;
  size_t __size;
  size_t extraout_RDX_00;
  size_t __size_00;
  size_t extraout_RDX_01;
  long lVar8;
  int iVar9;
  void *__ptr;
  vector<int> *pvVar10;
  long lVar11;
  vector<int> currComp;
  vector<bool> used;
  int local_54;
  vector<int> local_50;
  vector<bool> local_40;
  
  iVar9 = this->_nodeCnt;
  iVar6 = 1;
  do {
    iVar5 = iVar6;
    iVar6 = iVar5 * 2;
  } while (iVar5 < iVar9);
  iVar6 = -1;
  if (-1 < iVar5) {
    iVar6 = iVar5;
  }
  local_40._size = iVar9;
  __s = (bool *)operator_new__((long)iVar6);
  memset(__s,0,(long)iVar6);
  local_40.vect = __s;
  local_40._capacity = iVar5;
  local_50.vect = (int *)operator_new__(4);
  *local_50.vect = 0;
  local_50._size = 0;
  local_50._capacity = 1;
  local_54 = 0;
  __size = extraout_RDX;
  if (0 < iVar9) {
    do {
      __size = (size_t)local_54;
      if (local_40.vect[__size] == false) {
        while (local_50._size != 0) {
          local_50._size = local_50._size + -1;
          if (local_50._size <= local_50._capacity / 2) {
            vector<int>::realloc(&local_50,(void *)(ulong)(uint)(local_50._capacity / 2),__size);
            __size = extraout_RDX_00;
          }
        }
        currCC(this,&local_50,&local_40,&local_54);
        iVar9 = (this->compList)._size;
        iVar6 = (this->compList)._capacity;
        if (iVar6 <= iVar9) {
          vector<vector<int>_>::realloc(&this->compList,(void *)(ulong)(uint)(iVar6 * 2),__size_00);
          iVar9 = (this->compList)._size;
        }
        (this->compList)._size = iVar9 + 1;
        vector<int>::operator=((this->compList).vect + iVar9,&local_50);
        iVar9 = this->_nodeCnt;
        __size = extraout_RDX_01;
      }
      local_54 = local_54 + 1;
    } while (local_54 < iVar9);
  }
  uVar7 = 1;
  do {
    __ptr = (void *)(ulong)uVar7;
    bVar4 = (int)uVar7 < iVar9;
    uVar7 = uVar7 * 2;
  } while (bVar4);
  vector<int>::realloc(&this->inCC,__ptr,__size);
  (this->inCC)._size = iVar9;
  iVar9 = (this->compList)._size;
  if (0 < iVar9) {
    pvVar1 = (this->compList).vect;
    piVar2 = (this->inCC).vect;
    lVar8 = 0;
    do {
      if (0 < pvVar1[lVar8]._size) {
        pvVar10 = pvVar1 + lVar8;
        piVar3 = pvVar10->vect;
        lVar11 = 0;
        do {
          piVar2[piVar3[lVar11]] = (int)lVar8;
          lVar11 = lVar11 + 1;
        } while (lVar11 < pvVar10->_size);
        iVar9 = (this->compList)._size;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar9);
  }
  if (local_50.vect != (int *)0x0) {
    operator_delete__(local_50.vect);
  }
  if (local_40.vect != (bool *)0x0) {
    operator_delete__(local_40.vect);
  }
  return;
}

Assistant:

void connectedComponents() {
        vector <bool> used(_nodeCnt);
        vector <int> currComp;

        for (int i = 0; i < _nodeCnt; ++i) {
            if (!used[i]) {
                currComp.clear();
                currCC(currComp, used, i);
                compList.push_back(currComp);
            }
        }

        inCC.resize(_nodeCnt);
        for (int i = 0; i < compList.size(); ++i) {
            for (int j = 0; j < compList[i].size(); ++j) {
                int currNode = compList[i][j];
                inCC[currNode] = i;
            }
        }
    }